

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  MethodDescriptorProto *method;
  ServiceOptions *pSVar3;
  Arena *arena;
  string_view text;
  LocationRecorder location;
  LocationRecorder local_40;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (!bVar1) {
    if (((this->input_->current_).text._M_string_length == 6) &&
       (iVar2 = bcmp((this->input_->current_).text._M_dataplus._M_p,"option",6), iVar2 == 0)) {
      LocationRecorder::LocationRecorder(&local_40,service_location,3);
      *(byte *)&service->field_0 = *(byte *)&service->field_0 | 2;
      if ((service->field_0)._impl_.options_ == (ServiceOptions *)0x0) {
        arena = (Arena *)(service->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        pSVar3 = (ServiceOptions *)Arena::DefaultConstruct<google::protobuf::ServiceOptions>(arena);
        (service->field_0)._impl_.options_ = pSVar3;
      }
      bVar1 = ParseOption(this,&((service->field_0)._impl_.options_)->super_Message,&local_40,
                          containing_file,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&local_40,service_location,2,*(int *)((long)&service->field_0 + 0x10));
      method = (MethodDescriptorProto *)
               internal::RepeatedPtrFieldBase::AddMessageLite
                         (&(service->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                          Arena::DefaultConstruct<google::protobuf::MethodDescriptorProto>);
      bVar1 = ParseServiceMethod(this,method,&local_40,containing_file);
    }
    LocationRecorder::~LocationRecorder(&local_40);
    return bVar1;
  }
  return true;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kMethodFieldNumber,
                              service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}